

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

type fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[6],double_const&,true>
               (buffer_appender<char> out,char (*format_str) [6],double *args)

{
  type tVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  double local_38 [3];
  basic_string_view<char> local_20;
  
  local_38[0] = *args;
  local_20 = to_string_view<char,_0>(*format_str);
  args_00.field_1.args_ = in_R8.args_;
  args_00.desc_ = (unsigned_long_long)local_38;
  tVar1 = vformat_to<fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,char,true>
                    ((v7 *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                     (buffer_appender<char>)&local_20,(basic_string_view<char> *)0xa,args_00);
  return (type)tVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline auto format_to(OutputIt out, const S& format_str, Args&&... args) ->
    typename std::enable_if<enable, OutputIt>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to(out, to_string_view(format_str), vargs);
}